

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCipher.cpp
# Opt level: O0

void __thiscall
security::SimpleCipher::Cipher(SimpleCipher *this,uint8_t *data,uint bytes,uint64_t sequence)

{
  byte bVar1;
  uint32_t uVar4;
  ulong uVar5;
  undefined8 in_RCX;
  uint in_EDX;
  ushort *in_RSI;
  int *in_RDI;
  uint32_t x_1;
  uint i;
  uint32_t x;
  int i_2;
  int i_1;
  uint32_t k [4];
  uint32_t a [4];
  uint32_t n1;
  uint32_t n0;
  uint32_t r;
  uint8_t *p;
  uint8_t *p_1;
  uint local_f8;
  int local_f0;
  int local_ec;
  uint auStack_e8 [4];
  int local_d8 [4];
  uint32_t local_c8;
  uint32_t local_c4;
  uint local_b4;
  ushort *local_b0;
  ushort *local_a0;
  byte *local_98;
  uint local_8c;
  ushort *local_88;
  uint local_7c;
  byte *local_78;
  int local_6c;
  ushort *local_68;
  uint local_5c;
  ushort *local_58;
  uint local_4c;
  ushort *local_48;
  ushort *local_18;
  byte bVar2;
  byte bVar3;
  
  if ((*in_RDI != 0) || (in_RDI[1] != 0)) {
    local_c4 = (int)in_RCX + 0x80771ab1;
    local_b4 = in_EDX;
    local_b0 = in_RSI;
    local_c8 = MultiplyAndFold19((int)((ulong)in_RCX >> 0x20) + 0x55f2cc88,0xf3f77d13);
    uVar4 = MultiplyAndFold19(0x905c4577,local_c4);
    local_d8[0] = uVar4 + local_c8;
    uVar4 = MultiplyAndFold19(0xb84c88cb,local_c4);
    local_d8[1] = uVar4 + local_c8;
    uVar4 = MultiplyAndFold19(0xde0efbf1,local_c4);
    local_d8[2] = uVar4 + local_c8;
    uVar4 = MultiplyAndFold19(0x9f614c3d,local_c4);
    local_d8[3] = uVar4 + local_c8;
    for (local_ec = 0; local_ec < 4; local_ec = local_ec + 1) {
      auStack_e8[local_ec] = in_RDI[local_ec];
    }
    for (; 0xf < local_b4; local_b4 = local_b4 - 0x10) {
      for (local_f0 = 0; local_f0 < 4; local_f0 = local_f0 + 1) {
        auStack_e8[local_f0] = local_d8[local_f0] + auStack_e8[local_f0];
        local_98 = (byte *)((long)local_b0 + (long)(local_f0 << 2));
        local_7c = ((uint)local_98[3] << 0x18 | (uint)local_98[2] << 0x10 | (uint)local_98[1] << 8 |
                   (uint)*local_98) ^ auStack_e8[local_f0];
        local_78 = (byte *)((long)local_b0 + (long)(local_f0 << 2));
        local_78[3] = (byte)(local_7c >> 0x18);
        local_78[2] = (byte)(local_7c >> 0x10);
        local_78[1] = (byte)(local_7c >> 8);
        *local_78 = (byte)local_7c;
      }
      local_b0 = local_b0 + 8;
    }
    local_f8 = 0;
    for (; 3 < local_b4; local_b4 = local_b4 - 4) {
      auStack_e8[local_f8 & 3] = local_d8[local_f8 & 3] + auStack_e8[local_f8 & 3];
      local_a0 = local_b0;
      local_8c = ((uint)*(byte *)((long)local_b0 + 3) << 0x18 | (uint)(byte)local_b0[1] << 0x10 |
                  (uint)*(byte *)((long)local_b0 + 1) << 8 | (uint)(byte)*local_b0) ^
                 auStack_e8[local_f8 & 3];
      local_88 = local_b0;
      *(byte *)((long)local_b0 + 3) = (byte)(local_8c >> 0x18);
      *(byte *)(local_b0 + 1) = (byte)(local_8c >> 0x10);
      *(byte *)((long)local_b0 + 1) = (byte)(local_8c >> 8);
      *(byte *)local_b0 = (byte)local_8c;
      local_b0 = local_b0 + 2;
      local_f8 = local_f8 + 1;
    }
    if (local_b4 != 0) {
      uVar5 = (ulong)((local_f8 & 3) << 2);
      *(int *)((long)auStack_e8 + uVar5) =
           *(int *)((long)auStack_e8 + uVar5) + *(int *)((long)local_d8 + uVar5);
      local_58 = local_b0;
      local_5c = local_b4;
      local_68 = local_b0;
      local_6c = 0;
      switch(local_b4) {
      case 1:
        local_4c = (uint)(byte)*local_b0;
        break;
      case 3:
        local_6c = (uint)(byte)local_b0[1] << 0x10;
      case 2:
        local_18 = local_b0;
        local_4c = local_6c + (uint)*local_b0;
        break;
      case 4:
        local_48 = local_b0;
        local_4c = (uint)*(byte *)((long)local_b0 + 3) << 0x18 | (uint)(byte)local_b0[1] << 0x10 |
                   (uint)*(byte *)((long)local_b0 + 1) << 8 | (uint)(byte)*local_b0;
        break;
      default:
        local_4c = 0;
      }
      local_4c = local_4c ^ auStack_e8[local_f8 & 3];
      bVar1 = (byte)local_4c;
      bVar2 = (byte)(local_4c >> 0x10);
      bVar3 = (byte)(local_4c >> 8);
      switch(local_b4) {
      case 1:
        *(byte *)local_b0 = bVar1;
        break;
      case 3:
        *(byte *)(local_b0 + 1) = bVar2;
      case 2:
        *(byte *)((long)local_b0 + 1) = bVar3;
        *(byte *)local_b0 = bVar1;
        break;
      case 4:
        *(byte *)((long)local_b0 + 3) = (byte)(local_4c >> 0x18);
        *(byte *)(local_b0 + 1) = bVar2;
        *(byte *)((long)local_b0 + 1) = bVar3;
        *(byte *)local_b0 = bVar1;
      }
    }
  }
  return;
}

Assistant:

void SimpleCipher::Cipher(uint8_t* data, unsigned bytes, uint64_t sequence)
{
#ifndef SECURITY_ENABLE_ENCRYPTION
    SECURITY_UNUSED(data); SECURITY_UNUSED(bytes); SECURITY_UNUSED(nonce);
#else // SECURITY_ENABLE_ENCRYPTION
    // Skip encryption if the key is zero
    if (ExpandedKey[0] == 0 && ExpandedKey[1] == 0) {
        return;
    }

    /*
        Encryption and decryption are the same:

        (1) Mix session key and nonce into 16 byte datagram key
        (2) XOR 16 bytes of data at a time by the datagram key

        This admits a lot of attacks of course:  Plaintext data that is zeros
        will reveal the XOR key for the rest of that datagram.  Two 16-byte
        blocks can be XOR'd together to get the XOR of two plaintext pieces.
        Each key leak will eventually lead to session key recovery fairly fast.

        It's not secure. But it is very fast, hides the packet contents, and
        will slow down reverse-engineers who always win eventually.
    */

    static const uint32_t p0 = 0x905c4577;
    static const uint32_t p1 = 0xb84c88cb;
    static const uint32_t p2 = 0xde0efbf1;
    static const uint32_t p3 = 0x9f614c3d;
    static const uint32_t p4 = 0xf3f77d13;
    static const uint32_t x0 = 0x80771ab1;
    static const uint32_t x1 = 0x55f2cc88;

    const uint32_t n0 = (uint32_t)sequence + x0;
    const uint32_t n1 = MultiplyAndFold19((uint32_t)(sequence >> 32) + x1, p4);

    // Mix session key and nonce
    const uint32_t a[4] = {
        MultiplyAndFold19(p0, n0) + n1,
        MultiplyAndFold19(p1, n0) + n1,
        MultiplyAndFold19(p2, n0) + n1,
        MultiplyAndFold19(p3, n0) + n1
    };

    uint32_t k[4];
    for (int i = 0; i < 4; ++i) {
        k[i] = ExpandedKey[i];
    }

    // Handle sets of 16 bytes
#ifdef ENABLE_SIMD_ENCRYPTION
    if (bytes >= 16)
    {
        SECURITY_M128 key = _mm_set_epi32(k[3], k[2], k[1], k[0]);
        const SECURITY_M128 add = _mm_set_epi32(a[3], a[2], a[1], a[0]);

        while (bytes >= 16)
        {
            key = _mm_add_epi32(key, add);

            SECURITY_M128* data16 = reinterpret_cast<SECURITY_M128*>(data);
            _mm_storeu_si128(data16, _mm_xor_si128(_mm_loadu_si128(data16), key));

            data += 16, bytes -= 16;
        }

        union {
            SECURITY_M128 v;
            uint32_t a[4];
        } e;
        e.v = key;
        for (int i = 0; i < 4; ++i) {
            k[i] = e.a[i];
        }
    }
#else
    while (bytes >= 16)
    {
        for (int i = 0; i < 4; ++i)
        {
            k[i] += a[i];
            const uint32_t x = ReadU32_LE(data + i * 4) ^ k[i];
            WriteU32_LE(data + i * 4, x);
        }

        data += 16, bytes -= 16;
    }
#endif

    // XOR remaining bytes
    unsigned i = 0;
    while (bytes >= 4)
    {
        k[i & 3] += a[i & 3];

        WriteU32_LE(data, ReadU32_LE(data) ^ k[i & 3]);
        data += 4, bytes -= 4, ++i;
    }

    if (bytes > 0)
    {
        k[i & 3] += a[i & 3];

        uint32_t x = TailReadLE32(data, bytes);
        x ^= k[i & 3];
        TailWriteLE32(x, data, bytes);
    }
#endif // SECURITY_ENABLE_ENCRYPTION
}